

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::checkIfBecameIdle(RpcConnectionState *this)

{
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> *pRVar1;
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> *pRVar2;
  long *plVar3;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault local_38;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  local_30;
  
  if ((((((this->idle == false) &&
         (((long)(this->questions).slots.builder.pos - (long)(this->questions).slots.builder.ptr >>
          3) * -0x3333333333333333 -
          ((long)(this->questions).freeIds.c.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->questions).freeIds.c.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) == 0)) &&
        ((this->questions).highSlots.table.rows.builder.pos ==
         (this->questions).highSlots.table.rows.builder.ptr)) &&
       (((this->answers).presenceBits == 0 &&
        ((this->answers).high.table.rows.builder.pos == (this->answers).high.table.rows.builder.ptr)
        ))) && ((((long)(this->exports).slots.builder.pos - (long)(this->exports).slots.builder.ptr
                 >> 3) * 0x6db6db6db6db6db7 -
                 ((long)(this->exports).freeIds.c.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->exports).freeIds.c.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) == 0 &&
                (((this->exports).highSlots.table.rows.builder.pos ==
                  (this->exports).highSlots.table.rows.builder.ptr &&
                 ((this->imports).presenceBits == 0)))))) &&
     (((this->imports).high.table.rows.builder.pos == (this->imports).high.table.rows.builder.ptr &&
      (((long)(this->embargoes).slots.builder.pos - (long)(this->embargoes).slots.builder.ptr >> 4
        == (long)(this->embargoes).freeIds.c.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->embargoes).freeIds.c.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2 &&
       ((this->embargoes).highSlots.table.rows.builder.pos ==
        (this->embargoes).highSlots.table.rows.builder.ptr)))))) {
    pRVar1 = (this->exportsByCap).table.rows.builder.pos;
    pRVar2 = (this->exportsByCap).table.rows.builder.ptr;
    local_30.left =
         (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
         ((long)pRVar1 - (long)pRVar2 >> 4);
    local_30.right = (None *)((ulong)local_30.right & 0xffffffff00000000);
    local_30.op.content.ptr = " == ";
    local_30.op.content.size_ = 5;
    local_30.result = pRVar1 == pRVar2;
    if (!local_30.result) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x367,FAILED,"exportsByCap.size() == 0","_kjCondition,",
                 (DebugComparison<unsigned_long,_int> *)&local_30);
      kj::_::Debug::Fault::fatal(&local_38);
    }
    local_30.left = &this->flowWaiter;
    local_30.result = (this->flowWaiter).ptr.ptr == (PromiseFulfiller<void> *)0x0;
    local_30.right = (None *)&kj::none;
    local_30.op.content.ptr = " == ";
    local_30.op.content.size_ = 5;
    if (!local_30.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x368,FAILED,"flowWaiter == kj::none","_kjCondition,",&local_30);
      kj::_::Debug::Fault::fatal(&local_38);
    }
    this->idle = true;
    if ((this->connection).tag == 1) {
      plVar3 = *(long **)((long)&(this->connection).field_1 + 0x10);
      (**(code **)(*plVar3 + 0x28))(plVar3,1);
      return;
    }
  }
  return;
}

Assistant:

void checkIfBecameIdle() {
    // Checks if the connection has become idle, and if so, informs the VatNetwork by calling
    // setIdle(true). Generally, this must be called after erasing an entry from any of the
    // Four Tables.

    if (idle) return;  // already idle

    bool allTablesEmpty =
        questions.empty() && answers.empty() && exports.empty() && imports.empty() &&
        // Technically the embargoes table should always be empty if the others are, but it's not
        // expensive to check it.
        embargoes.empty();

    if (!allTablesEmpty) {
      // Not idle, don't do anything.
      return;
    }

    // Notes:
    // - `exportsByCap` is a reverse mapping of `exports` so should be empty if `exports` is empty.
    // - `tasks` only contains:
    //   (a) messageLoop()
    //   (b) instances of flowController->waitAllAcked(), which are meaningless if there are no
    //       calls outstanding, and
    //   (c) exceptions inserted specifically to break the connection
    //   Of these, only messageLoop() could cause the connection to become non-idle again, but
    //   that's a well-defined part of the setIdle() contract.
    // - `flowWaiter` is only non-null when a large number of calls are outstanding; if the tables
    //   are empty, it is null.
    //
    // Hence we know at this point that no further messages will be sent on this connection, unless
    // the app initiates a new bootstrap or a message is received. I.e., we are idle.

    KJ_ASSERT(exportsByCap.size() == 0);
    KJ_ASSERT(flowWaiter == kj::none);

    // OK, we can inform the VatNetwork of the idleness.
    idle = true;
    KJ_IF_SOME(c, connection.tryGet<Connected>()) {
      c.connection->setIdle(true);
    }
  }